

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_escaped_char<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char v)

{
  bool bVar1;
  uint32_t cp;
  undefined7 in_register_00000031;
  char v_array [1];
  find_escape_result<char> local_28;
  
  v_array[0] = v;
  local_28.begin = (char *)out.container;
  basic_appender<char>::operator=((basic_appender<char> *)&local_28,'\'');
  cp = (uint32_t)CONCAT71(in_register_00000031,v);
  bVar1 = needs_escape(cp);
  if ((v == '\'') || (v != '\"' && bVar1)) {
    local_28.begin = v_array;
    local_28.end = (char *)&local_28;
    local_28.cp = cp;
    out = write_escaped_cp<fmt::v11::basic_appender<char>,char>(out,&local_28);
  }
  else {
    local_28.begin = (char *)out.container;
    basic_appender<char>::operator=((basic_appender<char> *)&local_28,v);
  }
  local_28.begin = (char *)out.container;
  basic_appender<char>::operator=((basic_appender<char> *)&local_28,'\'');
  return (basic_appender<char>)out.container;
}

Assistant:

auto write_escaped_char(OutputIt out, Char v) -> OutputIt {
  Char v_array[1] = {v};
  *out++ = static_cast<Char>('\'');
  if ((needs_escape(static_cast<uint32_t>(v)) && v != static_cast<Char>('"')) ||
      v == static_cast<Char>('\'')) {
    out = write_escaped_cp(out,
                           find_escape_result<Char>{v_array, v_array + 1,
                                                    static_cast<uint32_t>(v)});
  } else {
    *out++ = v;
  }
  *out++ = static_cast<Char>('\'');
  return out;
}